

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void save_cb(Fl_Widget *param_1,void *v)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *local_88;
  char *basename;
  char *local_70;
  char *c;
  Fl_Native_File_Chooser fnfc;
  void *v_local;
  Fl_Widget *param_0_local;
  
  fnfc.field_10 = (anon_union_8_2_9d171da7_for_Fl_Native_File_Chooser_12)v;
  Fl_Native_File_Chooser::Fl_Native_File_Chooser((Fl_Native_File_Chooser *)&c,0);
  local_70 = filename;
  if (((fnfc.field_10._x11_file_chooser != (Fl_FLTK_File_Chooser *)0x0) || (filename == (char *)0x0)
      ) || (*filename == '\0')) {
    Fl_Native_File_Chooser::title((Fl_Native_File_Chooser *)&c,"Save To:");
    Fl_Native_File_Chooser::type((Fl_Native_File_Chooser *)&c,4);
    Fl_Native_File_Chooser::filter((Fl_Native_File_Chooser *)&c,"FLUID Files\t*.f[ld]");
    iVar1 = Fl_Native_File_Chooser::show((Fl_Native_File_Chooser *)&c);
    if (iVar1 != 0) goto LAB_001bd3c7;
    local_70 = Fl_Native_File_Chooser::filename((Fl_Native_File_Chooser *)&c);
    iVar1 = access(local_70,0);
    if (iVar1 == 0) {
      pcVar2 = strrchr(local_70,0x2f);
      local_88 = local_70;
      if (pcVar2 != (char *)0x0) {
        local_88 = pcVar2 + 1;
      }
      iVar1 = fl_choice("The file \"%s\" already exists.\nDo you want to replace it?","Cancel",
                        "Replace",(char *)0x0,local_88);
      if (iVar1 == 0) goto LAB_001bd3c7;
    }
    if (fnfc.field_10._x11_file_chooser != (Fl_FLTK_File_Chooser *)&DAT_00000002) {
      set_filename(local_70);
    }
  }
  iVar1 = write_file(local_70,0);
  if (iVar1 == 0) {
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    fl_alert("Error writing %s: %s",local_70,pcVar2);
  }
  else if (fnfc.field_10._x11_file_chooser != (Fl_FLTK_File_Chooser *)&DAT_00000002) {
    set_modflag(0);
    undo_save = undo_current;
  }
LAB_001bd3c7:
  Fl_Native_File_Chooser::~Fl_Native_File_Chooser((Fl_Native_File_Chooser *)&c);
  return;
}

Assistant:

void save_cb(Fl_Widget *, void *v) {
  Fl_Native_File_Chooser fnfc;
  const char *c = filename;
  if (v || !c || !*c) {    
    fnfc.title("Save To:");
    fnfc.type(Fl_Native_File_Chooser::BROWSE_SAVE_FILE);
    fnfc.filter("FLUID Files\t*.f[ld]");
    if (fnfc.show() != 0) return;
    c = fnfc.filename();
    if (!access(c, 0)) {
      const char *basename;
      if ((basename = strrchr(c, '/')) != NULL)
        basename ++;
#if defined(WIN32) || defined(__EMX__)
      if ((basename = strrchr(c, '\\')) != NULL)
        basename ++;
#endif // WIN32 || __EMX__
      else
        basename = c;

      if (fl_choice("The file \"%s\" already exists.\n"
                    "Do you want to replace it?", "Cancel",
		    "Replace", NULL, basename) == 0) return;
    }

    if (v != (void *)2) set_filename(c);
  }
  if (!write_file(c)) {
    fl_alert("Error writing %s: %s", c, strerror(errno));
    return;
  }

  if (v != (void *)2) {
    set_modflag(0);
    undo_save = undo_current;
  }
}